

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_set.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalSet *op)

{
  pointer *pprVar1;
  iterator __position;
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar2;
  pointer pPVar3;
  PhysicalOperator *pPVar4;
  reference_wrapper<duckdb::PhysicalOperator> local_30;
  
  if ((op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    pPVar2 = CreatePlan(this,op_00);
    pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&this->physical_plan);
    pPVar4 = PhysicalPlan::Make<duckdb::PhysicalSetVariable,std::__cxx11::string,unsigned_long&>
                       (pPVar3,&op->name,&(op->super_LogicalOperator).estimated_cardinality);
    __position._M_current =
         (pPVar4->children).
         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar4->children).
        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_30._M_data = pPVar2;
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&pPVar4->children,__position,&local_30);
    }
    else {
      (__position._M_current)->_M_data = pPVar2;
      pprVar1 = &(pPVar4->children).
                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
    return pPVar4;
  }
  pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  pPVar2 = PhysicalPlan::
           Make<duckdb::PhysicalSet,std::__cxx11::string&,duckdb::Value&,duckdb::SetScope&,unsigned_long&>
                     (pPVar3,&op->name,&op->value,&op->scope,
                      &(op->super_LogicalOperator).estimated_cardinality);
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalSet &op) {
	// Set a config setting.
	if (op.children.empty()) {
		return Make<PhysicalSet>(op.name, op.value, op.scope, op.estimated_cardinality);
	}

	// Set a variable.
	auto &plan = CreatePlan(*op.children[0]);
	auto &set_variable = Make<PhysicalSetVariable>(std::move(op.name), op.estimated_cardinality);
	set_variable.children.push_back(plan);
	return set_variable;
}